

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddGenetic.c
# Opt level: O2

int find_best(void)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  int *piVar4;
  ulong uVar5;
  
  iVar3 = numvars + 1;
  piVar4 = storedd + (long)numvars + (long)iVar3;
  uVar2 = 0;
  for (uVar5 = 1; (long)uVar5 < (long)popsize; uVar5 = uVar5 + 1) {
    uVar1 = uVar5 & 0xffffffff;
    if (storedd[iVar3 * (int)uVar2 + numvars] <= *piVar4) {
      uVar1 = uVar2;
    }
    uVar2 = uVar1;
    piVar4 = piVar4 + iVar3;
  }
  return (int)uVar2;
}

Assistant:

static int
find_best(void)
{
    int i,small;

    small = 0;
    for (i = 1; i < popsize; i++) {
        if (STOREDD(i,numvars) < STOREDD(small,numvars)) {
            small = i;
        }
    }
    return(small);

}